

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O1

size_t __thiscall
trieste::PassDef::apply_special<false,true,true>(PassDef *this,Node *root,Match *match)

{
  Effect<Node> *pEVar1;
  _Rb_tree_header *p_Var2;
  uint uVar3;
  TokenDef *pTVar4;
  Node *node;
  element_type *peVar5;
  element_type *peVar6;
  long *plVar7;
  Effect<Node> *pEVar8;
  char cVar9;
  size_t sVar10;
  __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
  _Var11;
  long lVar12;
  _Base_ptr p_Var13;
  element_type *peVar14;
  _Base_ptr p_Var15;
  element_type *peVar16;
  ptrdiff_t pVar17;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var18;
  Effect<Node> *pEVar19;
  bool bVar20;
  iterator it;
  vector<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>
  path;
  iterator start;
  Node root_1;
  pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
  local_a8;
  element_type *local_98;
  iterator iStack_90;
  pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
  *local_88;
  size_t local_80;
  PassDef *local_78;
  long local_70;
  NodeIt local_68;
  element_type *local_60;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_58;
  Token local_50;
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  size_t local_38;
  
  std::__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<trieste::NodeDef,void>
            ((__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffa0,
             (__weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)
             (root->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  pTVar4 = (local_60->type_).def;
  uVar3 = pTVar4->fl;
  if ((uVar3 & 0x40) == 0) {
    p_Var2 = &(this->pre_)._M_t._M_impl.super__Rb_tree_header;
    p_Var13 = (this->pre_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var15 = &p_Var2->_M_header;
    for (; p_Var13 != (_Base_ptr)0x0;
        p_Var13 = (&p_Var13->_M_left)[*(TokenDef **)(p_Var13 + 1) < pTVar4]) {
      if (*(TokenDef **)(p_Var13 + 1) >= pTVar4) {
        p_Var15 = p_Var13;
      }
    }
    p_Var13 = &p_Var2->_M_header;
    if (((_Rb_tree_header *)p_Var15 != p_Var2) &&
       (p_Var13 = p_Var15, pTVar4 < *(TokenDef **)(p_Var15 + 1))) {
      p_Var13 = &p_Var2->_M_header;
    }
    if ((_Rb_tree_header *)p_Var13 != p_Var2) {
      local_98 = local_60;
      iStack_90._M_current =
           (pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
            *)local_58._M_pi;
      if ((element_type *)local_58._M_pi != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&(local_58._M_pi)->_M_use_count)->
                   _M_pi =
               *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&(local_58._M_pi)->_M_use_count
                        )->_M_pi + 1;
          UNLOCK();
        }
        else {
          *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&(local_58._M_pi)->_M_use_count)->
                   _M_pi =
               *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&(local_58._M_pi)->_M_use_count
                        )->_M_pi + 1;
        }
      }
      if (p_Var13[1]._M_right == (_Base_ptr)0x0) {
        std::__throw_bad_function_call();
      }
      sVar10 = (**(code **)(p_Var13 + 2))(&p_Var13[1]._M_parent,&local_98);
      if ((element_type *)iStack_90._M_current != (element_type *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)iStack_90._M_current);
      }
      goto LAB_00177fac;
    }
  }
  sVar10 = 0;
LAB_00177fac:
  if ((uVar3 & 0x40) == 0) {
    local_98 = (element_type *)0x0;
    iStack_90._M_current =
         (pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
          *)0x0;
    local_88 = (pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
                *)0x0;
    local_a8.second._M_current =
         (local_60->children).
         super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_a8.first = (shared_ptr<trieste::NodeDef> *)&stack0xffffffffffffffa0;
    std::
    vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
    ::
    _M_realloc_insert<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>
              ((vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
                *)&local_98,(iterator)0x0,&local_a8);
    if (local_98 != (element_type *)iStack_90._M_current) {
      local_48 = (element_type *)&(this->pre_)._M_t._M_impl.super__Rb_tree_header;
      _Var18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     &(this->post_)._M_t._M_impl.super__Rb_tree_header;
      local_80 = sVar10;
      local_78 = this;
      local_40._M_pi = _Var18._M_pi;
      do {
        node = (((element_type *)((long)iStack_90._M_current + -0x70))->children).
               super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
        peVar5 = (element_type *)
                 (((element_type *)((long)iStack_90._M_current + -0x70))->children).
                 super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (peVar5 == (element_type *)
                      (((node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->children).
                      super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
          local_38 = *(size_t *)
                      ((long)(local_78->rule_map).map._M_elems +
                      (ulong)(((((node->
                                 super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr)->type_).def)->default_map_id & 0xfffffff8));
          if ((*(char *)(local_38 + 0x418) == '\0') &&
             (local_a8.first =
                   (((node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                    )->children).
                   super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
             (element_type *)local_a8.first !=
             (element_type *)
             (((node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             children).
             super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)) {
            local_70 = 0;
            do {
              local_68._M_current = local_a8.first;
              plVar7 = *(long **)(local_38 + 0x18 +
                                 (ulong)(((((((enable_shared_from_this<trieste::NodeDef> *)
                                             &(local_a8.first)->
                                              super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>
                                             )->_M_weak_this).
                                            super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)->type_).def)->default_map_id & 0xfffffff8));
              pEVar19 = (Effect<Node> *)*plVar7;
              pEVar8 = (Effect<Node> *)plVar7[1];
              if (pEVar19 == pEVar8) {
                pVar17 = -1;
              }
              else {
                pEVar19 = pEVar19 + 4;
                pVar17 = -1;
                do {
                  match->index = 0;
                  ((match->captures).
                   super__Vector_base<std::pair<bool,_std::map<trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>_>_>,_std::allocator<std::pair<bool,_std::map<trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->first = false;
                  plVar7 = *(long **)&pEVar19[-4].super__Function_base._M_functor;
                  cVar9 = (**(code **)(*plVar7 + 0x20))(plVar7,&local_a8,node,match);
                  if (cVar9 == '\0') {
LAB_00178198:
                    local_a8.first = local_68._M_current;
                    bVar20 = false;
                  }
                  else {
                    local_50.def = (TokenDef *)local_a8.first;
                    _Var11 = std::
                             __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>,__gnu_cxx::__ops::_Iter_pred<trieste::range_contains_error(__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>)::_lambda(auto:1&)_1_>>
                                       (local_68._M_current);
                    if ((TokenDef *)_Var11._M_current != local_50.def) goto LAB_00178198;
                    pVar17 = replace(local_78,match,pEVar19,&local_68,(NodeIt *)&local_a8,node);
                    if (pVar17 == -1) {
                      pVar17 = -1;
                      goto LAB_00178198;
                    }
                    local_70 = local_70 + pVar17;
                    bVar20 = true;
                  }
                } while ((!bVar20) &&
                        (pEVar1 = pEVar19 + 1, pEVar19 = pEVar19 + 5, pEVar1 != pEVar8));
              }
              if (pVar17 == -1) {
                local_a8.first = (shared_ptr<trieste::NodeDef> *)((long)local_a8.first + 0x10);
              }
              else if ((local_78->direction_ & 4) == 0) {
                local_a8.first =
                     (((node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->children).
                     super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
              }
              else {
                local_a8.first =
                     (shared_ptr<trieste::NodeDef> *)
                     ((enable_shared_from_this<trieste::NodeDef> *)
                      &(local_a8.first)->
                       super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> + pVar17);
              }
              _Var18._M_pi = local_40._M_pi;
              lVar12 = local_70;
            } while ((element_type *)local_a8.first !=
                     (element_type *)
                     (((node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->children).
                     super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          }
          else {
            lVar12 = 0;
          }
          peVar5 = (node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          p_Var13 = (local_78->post_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var15 = (_Base_ptr)_Var18._M_pi;
          if (p_Var13 != (_Base_ptr)0x0) {
            do {
              bVar20 = *(TokenDef **)(p_Var13 + 1) < (peVar5->type_).def;
              if (!bVar20) {
                p_Var15 = p_Var13;
              }
              p_Var13 = (&p_Var13->_M_left)[bVar20];
            } while (p_Var13 != (_Base_ptr)0x0);
          }
          p_Var13 = (_Base_ptr)_Var18._M_pi;
          if ((p_Var15 != (_Base_ptr)_Var18._M_pi) &&
             (p_Var13 = p_Var15, (peVar5->type_).def < *(TokenDef **)(p_Var15 + 1))) {
            p_Var13 = (_Base_ptr)_Var18._M_pi;
          }
          sVar10 = lVar12 + local_80;
          if (p_Var13 != (_Base_ptr)_Var18._M_pi) {
            local_a8.second._M_current =
                 (shared_ptr<trieste::NodeDef> *)
                 (node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.second._M_current !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.second._M_current)->
                _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               local_a8.second._M_current)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.second._M_current)->
                _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               local_a8.second._M_current)->_M_use_count + 1;
              }
            }
            local_a8.first = (shared_ptr<trieste::NodeDef> *)peVar5;
            if (p_Var13[1]._M_right == (_Base_ptr)0x0) {
              std::__throw_bad_function_call();
            }
            lVar12 = (**(code **)(p_Var13 + 2))(&p_Var13[1]._M_parent,&local_a8);
            sVar10 = lVar12 + sVar10;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.second._M_current !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.second._M_current)
              ;
            }
          }
          iStack_90._M_current =
               (pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
                *)&(((element_type *)((long)iStack_90._M_current + -0x70))->children).
                   super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          (((element_type *)((long)iStack_90._M_current + -0x70))->children).
          super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&peVar5->type_;
          peVar6 = (peVar5->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                   super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          pTVar4 = (peVar6->type_).def;
          uVar3 = pTVar4->fl;
          sVar10 = local_80;
          if ((uVar3 & 0x40) == 0) {
            peVar16 = local_48;
            for (peVar14 = (element_type *)
                           (local_78->pre_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                peVar14 != (element_type *)0x0;
                peVar14 = *(element_type **)((long)&(peVar14->origin_).field_2 + (ulong)bVar20 * 8))
            {
              bVar20 = (TokenDef *)(peVar14->contents)._M_dataplus._M_p < pTVar4;
              if (!bVar20) {
                peVar16 = peVar14;
              }
            }
            peVar14 = local_48;
            if ((peVar16 != local_48) &&
               (peVar14 = peVar16, pTVar4 < (TokenDef *)(peVar16->contents)._M_dataplus._M_p)) {
              peVar14 = local_48;
            }
            if (peVar14 != local_48) {
              local_a8.second._M_current =
                   (shared_ptr<trieste::NodeDef> *)
                   (peVar5->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                   super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.second._M_current !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.second._M_current)->
                  _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                 local_a8.second._M_current)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.second._M_current)->
                  _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                 local_a8.second._M_current)->_M_use_count + 1;
                }
              }
              local_a8.first = (shared_ptr<trieste::NodeDef> *)peVar6;
              if (*(long *)((long)&(peVar14->contents).field_2 + 8) == 0) {
                std::__throw_bad_function_call();
              }
              lVar12 = (*(code *)(peVar14->lines).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start)
                                 (&(peVar14->contents)._M_string_length,&local_a8);
              sVar10 = lVar12 + local_80;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.second._M_current !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_a8.second._M_current);
              }
            }
          }
          if ((uVar3 & 0x40) == 0) {
            local_a8.second._M_current =
                 *(shared_ptr<trieste::NodeDef> **)
                  &(((peVar5->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                     super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   children).
                   super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
            ;
            local_a8.first = (shared_ptr<trieste::NodeDef> *)peVar5;
            if (iStack_90._M_current == local_88) {
              std::
              vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
              ::
              _M_realloc_insert<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>
                        ((vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
                          *)&local_98,iStack_90,&local_a8);
            }
            else {
              (iStack_90._M_current)->first = (shared_ptr<trieste::NodeDef> *)peVar5;
              ((iStack_90._M_current)->second)._M_current = local_a8.second._M_current;
              iStack_90._M_current = iStack_90._M_current + 1;
            }
          }
        }
        local_80 = sVar10;
      } while (local_98 != (element_type *)iStack_90._M_current);
    }
    if (local_98 != (element_type *)0x0) {
      operator_delete(local_98,(long)local_88 - (long)local_98);
    }
  }
  if ((element_type *)local_58._M_pi != (element_type *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
  }
  return sVar10;
}

Assistant:

size_t apply_special(Node root, Match& match)
    {
      size_t changes = 0;

      auto add = [&](Node& node) SNMALLOC_FAST_PATH_LAMBDA {
        // Don't examine Error or Lift nodes.
        if (node->type() & flag::internal)
          return false;

        if constexpr (Pre)
        {
          auto pre_f = pre_.find(node->type());
          if (pre_f != pre_.end())
            changes += pre_f->second(node);
        }
        if constexpr (Topdown)
          changes += match_children(node, match);

        return true;
      };

      auto remove = [&](Node& node) SNMALLOC_FAST_PATH_LAMBDA {
        if constexpr (!Topdown)
          changes += match_children(node, match);
        else
          snmalloc::UNUSED(node);
        if constexpr (Post)
        {
          auto post_f = post_.find(node->type());
          if (post_f != post_.end())
            changes += post_f->second(node);
        }
      };

      root->traverse(add, remove);

      return changes;
    }